

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

QSize __thiscall QtMWidgets::AbstractScrollArea::sizeHint(AbstractScrollArea *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  AbstractScrollAreaPrivate *pAVar5;
  int *piVar6;
  QSize QVar7;
  QSize local_64;
  QSize local_5c [2];
  QWidget local_48 [12];
  int local_3c [3];
  int h;
  QSize frameSize;
  QSize marginsSize;
  QSize viewportSizeHint;
  AbstractScrollArea *this_local;
  
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  marginsSize = (QSize)(**(code **)(*(long *)pAVar5->viewport + 0x70))();
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  iVar3 = pAVar5->left;
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  iVar4 = pAVar5->right;
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  iVar1 = pAVar5->top;
  pAVar5 = QScopedPointer<QtMWidgets::AbstractScrollAreaPrivate,_QScopedPointerDeleter<QtMWidgets::AbstractScrollAreaPrivate>_>
           ::operator->(&this->d);
  QSize::QSize(&frameSize,iVar3 + iVar4,iVar1 + pAVar5->bottom);
  iVar3 = QFrame::frameWidth();
  iVar4 = QFrame::frameWidth();
  QSize::QSize((QSize *)&stack0xffffffffffffffd0,iVar3 << 1,iVar4 << 1);
  bVar2 = QSize::isValid(&marginsSize);
  if (!bVar2) {
    local_3c[1] = 10;
    QWidget::fontMetrics(local_48);
    local_3c[0] = QFontMetrics::height();
    piVar6 = qMax<int>(local_3c + 1,local_3c);
    iVar3 = *piVar6;
    QFontMetrics::~QFontMetrics((QFontMetrics *)local_48);
    local_3c[2] = iVar3;
    QSize::QSize(local_5c,iVar3 * 6,iVar3 << 2);
    marginsSize = local_5c[0];
  }
  local_64 = operator+(&marginsSize,&frameSize);
  QVar7 = operator+(&local_64,(QSize *)&stack0xffffffffffffffd0);
  return QVar7;
}

Assistant:

QSize
AbstractScrollArea::sizeHint() const
{
	QSize viewportSizeHint = d->viewport->sizeHint();
	const QSize marginsSize = QSize( d->left + d->right, d->top + d->bottom );
	const QSize frameSize = QSize( frameWidth() * 2, frameWidth() * 2 );

	if( !viewportSizeHint.isValid() )
	{
		const int h = qMax( 10, fontMetrics().height() );
		viewportSizeHint = QSize( 6 * h, 4 * h );
	}

	return viewportSizeHint + marginsSize + frameSize;
}